

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

string_char lsvm::string::next(iterator *it)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  string *psVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  
  psVar4 = it->s;
  uVar2 = psVar4->size;
  if (it->p < (int)uVar2) {
    it->p = it->p + 1;
  }
  uVar3 = it->p;
  lVar7 = (long)(int)uVar3;
  uVar5 = 0;
  if (uVar2 != uVar3) {
    bVar1 = *(byte *)((long)&psVar4[1].count + lVar7);
    uVar5 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      return uVar5;
    }
    if (bVar1 < 0xe0) {
      uVar5 = (uVar5 & 0x1f) << 6;
      iVar8 = 1;
      lVar6 = 1;
    }
    else if (bVar1 < 0xf0) {
      uVar5 = (*(byte *)((long)&psVar4[1].count + lVar7 + 1) & 0x3f | (uVar5 & 0xf) << 6) << 6;
      iVar8 = 2;
      lVar6 = 2;
    }
    else {
      if (0xf4 < bVar1) {
        return 0;
      }
      uVar5 = (*(byte *)((long)&psVar4[1].count + lVar7 + 2) & 0x3f) << 6 |
              (*(byte *)((long)&psVar4[1].count + lVar7 + 1) & 0x3f | (uVar5 & 7) << 6) << 0xc;
      iVar8 = 3;
      lVar6 = 3;
    }
    uVar5 = *(byte *)((long)&psVar4[1].count + lVar6 + lVar7) & 0x3f | uVar5;
    it->p = uVar3 + iVar8;
  }
  return uVar5;
}

Assistant:

string_char next(iterator* it){
    string_char sc = 0;    
    if((int32_t)it->s->size > it->p)
        it->p += 1;
    if((int32_t)it->s->size == it->p)
        return null;

    uint8_t* s = reinterpret_cast<uint8_t*>(it->s+1);
    s += it->p;
    
    if (*s < 0x80) {
        sc = (*s & 0x7F);
    } else if (*s < 0xE0) {
        sc = (*s & 0x1F);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        it->p += 1;
    } else if (*s < 0xF0) {
        sc = (*s & 0xF);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        it->p += 2;
    } else if (*s < 0xF5) {
        sc = (*s & 0x7);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        sc <<= 6;
        sc |= (*(s+3) & 0x3F);
        it->p += 3;
    }

    return sc;
}